

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliX.hpp
# Opt level: O1

SquareMatrix<double> __thiscall qclab::qgates::PauliX<double>::matrix(PauliX<double> *this)

{
  undefined8 *puVar1;
  SquareMatrix<double> SVar2;
  
  (this->super_QGate1<double>).super_QObject<double>._vptr_QObject = (_func_int **)0x2;
  puVar1 = (undefined8 *)operator_new__(0x20);
  *(undefined8 **)&(this->super_QGate1<double>).qubit_ = puVar1;
  *puVar1 = 0;
  puVar1[1] = 0x3ff0000000000000;
  puVar1[2] = 0x3ff0000000000000;
  puVar1[3] = 0;
  SVar2.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)0x3ff0000000000000;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 0 , 1 ,
                                                  1 , 0 ) ;
        }